

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

value_type __thiscall djb::fresnel::schlick::eval(schlick *this,float_t zd)

{
  float fVar1;
  _func_int **pp_Var2;
  long lVar3;
  void *pvVar4;
  _func_int **extraout_RDX;
  _func_int **pp_Var5;
  long in_RSI;
  float fVar6;
  value_type vVar7;
  
  if ((0.0 <= zd) && (zd <= 1.0)) {
    pp_Var2 = *(_func_int ***)(in_RSI + 8);
    (this->super_impl)._vptr_impl = pp_Var2;
    pvVar4 = operator_new((long)pp_Var2 * 4);
    (this->f0)._M_size = (size_t)pvVar4;
    pp_Var5 = extraout_RDX;
    if (pp_Var2 != (_func_int **)0x0) {
      fVar6 = 1.0 - zd;
      lVar3 = *(long *)(in_RSI + 0x10);
      pp_Var5 = (_func_int **)0x0;
      do {
        fVar1 = *(float *)(lVar3 + (long)pp_Var5 * 4);
        *(float *)((long)pvVar4 + (long)pp_Var5 * 4) =
             (1.0 - fVar1) * fVar6 * fVar6 * fVar6 * fVar6 * fVar6 + fVar1;
        pp_Var5 = (_func_int **)((long)pp_Var5 + 1);
      } while (pp_Var2 != pp_Var5);
    }
    vVar7._M_data = (float *)pp_Var5;
    vVar7._M_size = (size_t)this;
    return vVar7;
  }
  __assert_fail("zd >= 0 && zd <= 1 && \"Invalid Angle\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x483,"virtual brdf::value_type djb::fresnel::schlick::eval(float_t) const");
}

Assistant:

brdf::value_type schlick::eval(float_t zd) const
{
	DJB_ASSERT(zd >= 0 && zd <= 1 && "Invalid Angle");
	float_t c1 = 1 - zd;
	float_t c2 = c1 * c1;
	float_t c5 = c2 * c2 * c1;

	return f0 + c5 * ((float_t)1 - f0);
}